

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_ManPrintDistrib(Cba_Man_t *p)

{
  int iVar1;
  int iVar2;
  int *pUserCounts_00;
  Cba_Ntk_t *p_00;
  int *pUserCounts;
  int pCounts [90];
  int i;
  Cba_Ntk_t *pNtk;
  Cba_Man_t *p_local;
  
  memset(&pUserCounts,0,0x168);
  iVar1 = Cba_ManNtkNum(p);
  pUserCounts_00 = (int *)calloc((long)(iVar1 + 1),4);
  Cba_ManCreatePrimMap(p->pTypeNames);
  for (pCounts[0x59] = 1; iVar1 = pCounts[0x59], iVar2 = Cba_ManNtkNum(p), iVar1 <= iVar2;
      pCounts[0x59] = pCounts[0x59] + 1) {
    p_00 = Cba_ManNtk(p,pCounts[0x59]);
    Cba_NtkCollectDistrib(p_00,(int *)&pUserCounts,pUserCounts_00);
  }
  Cba_ManPrintDistribStat(p,(int *)&pUserCounts,pUserCounts_00);
  if (pUserCounts_00 != (int *)0x0) {
    free(pUserCounts_00);
  }
  return;
}

Assistant:

void Cba_ManPrintDistrib( Cba_Man_t * p )
{
    Cba_Ntk_t * pNtk; int i;
    int pCounts[CBA_BOX_LAST] = {0};
    int * pUserCounts = ABC_CALLOC( int, Cba_ManNtkNum(p) + 1 );
    Cba_ManCreatePrimMap( p->pTypeNames );
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_NtkCollectDistrib( pNtk, pCounts, pUserCounts );
    Cba_ManPrintDistribStat( p, pCounts, pUserCounts );
    ABC_FREE( pUserCounts );
}